

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::NumberStringBuilder::getAllFieldPositions
          (NumberStringBuilder *this,FieldPositionIteratorHandler *fpih,UErrorCode *status)

{
  UNumberFormatFields UVar1;
  ValueOrHeapArray<UNumberFormatFields> *pVVar2;
  UNumberFormatFields UVar3;
  ulong uVar4;
  ulong uVar5;
  uint local_34;
  
  if (0 < this->fLength) {
    local_34 = 0xffffffff;
    uVar4 = 0xb;
    uVar5 = 0;
    do {
      pVVar2 = &this->fFields;
      if (this->fUsingHeap != false) {
        pVVar2 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      UVar1 = pVVar2->value[(long)this->fZero + uVar5];
      UVar3 = (UNumberFormatFields)uVar4;
      if (UVar1 == UNUM_GROUPING_SEPARATOR_FIELD && UVar3 == UNUM_INTEGER_FIELD) {
        (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                  (fpih,6,uVar5 & 0xffffffff,(ulong)((uint)uVar5 + 1));
        uVar4 = 0;
      }
      else if (UVar3 != UVar1) {
        if (UVar3 != UNUM_FIELD_COUNT) {
          (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                    (fpih,uVar4,(ulong)local_34,uVar5 & 0xffffffff);
        }
        uVar4 = (ulong)UVar1;
        local_34 = (uint)uVar5;
      }
      if (U_ZERO_ERROR < *status) {
        return;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < this->fLength);
    if ((int)uVar4 != 0xb) {
      (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                (fpih,uVar4,(ulong)local_34);
      return;
    }
  }
  return;
}

Assistant:

void NumberStringBuilder::getAllFieldPositions(FieldPositionIteratorHandler& fpih,
                                               UErrorCode& status) const {
    Field current = UNUM_FIELD_COUNT;
    int32_t currentStart = -1;
    for (int32_t i = 0; i < fLength; i++) {
        Field field = fieldAt(i);
        if (current == UNUM_INTEGER_FIELD && field == UNUM_GROUPING_SEPARATOR_FIELD) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            fpih.addAttribute(UNUM_GROUPING_SEPARATOR_FIELD, i, i + 1);
        } else if (current != field) {
            if (current != UNUM_FIELD_COUNT) {
                fpih.addAttribute(current, currentStart, i);
            }
            current = field;
            currentStart = i;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (current != UNUM_FIELD_COUNT) {
        fpih.addAttribute(current, currentStart, fLength);
    }
}